

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.c
# Opt level: O2

void deinterleave_data(float *in,float *out,int frames,int channels)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  float *pfVar4;
  ulong uVar5;
  
  uVar1 = 0;
  uVar2 = 0;
  if (0 < frames) {
    uVar2 = (ulong)(uint)frames;
  }
  uVar3 = 0;
  if (0 < channels) {
    uVar3 = (ulong)(uint)channels;
  }
  for (; uVar1 != uVar3; uVar1 = uVar1 + 1) {
    pfVar4 = in;
    for (uVar5 = 0; uVar2 != uVar5; uVar5 = uVar5 + 1) {
      out[uVar5] = *pfVar4;
      pfVar4 = pfVar4 + channels;
    }
    out = out + frames;
    in = in + 1;
  }
  return;
}

Assistant:

void
deinterleave_data (const float *in, float *out, int frames, int channels)
{	int fr, ch ;

	for (ch = 0 ; ch < channels ; ch++)
		for (fr = 0 ; fr < frames ; fr++)
			out [fr + frames * ch] = in [ch + channels * fr] ;

	return ;
}